

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O1

Hop_Obj_t * Hop_CreateAnd(Hop_Man_t *p,int nVars)

{
  Hop_Obj_t *p1;
  Hop_Obj_t *p0;
  int i;
  
  p0 = p->pConst1;
  if (0 < nVars) {
    i = 0;
    do {
      p1 = Hop_IthVar(p,i);
      p0 = Hop_And(p,p0,p1);
      i = i + 1;
    } while (nVars != i);
  }
  return p0;
}

Assistant:

Hop_Obj_t * Hop_CreateAnd( Hop_Man_t * p, int nVars )
{
    Hop_Obj_t * pFunc;
    int i;
    pFunc = Hop_ManConst1( p );
    for ( i = 0; i < nVars; i++ )
        pFunc = Hop_And( p, pFunc, Hop_IthVar(p, i) );
    return pFunc;
}